

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_23::BinaryReader::ReadCustomSection(BinaryReader *this,Offset section_size)

{
  string_view x;
  string_view x_00;
  string_view x_01;
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  bool local_d9;
  string_view local_c8;
  char *local_b8;
  char *local_b0;
  Enum local_a8;
  Enum local_a4;
  string_view local_a0;
  char *local_90;
  char *local_88;
  undefined4 local_80;
  Enum local_7c;
  string_view local_78;
  char *local_68;
  char *local_60;
  undefined1 local_58 [8];
  ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_> guard
  ;
  undefined1 local_30 [8];
  string_view section_name;
  Offset section_size_local;
  BinaryReader *this_local;
  
  section_name.size_ = section_size;
  string_view::string_view((string_view *)local_30);
  RVar2 = ReadStr(this,(string_view *)local_30,"section name");
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  guard._8_8_ = local_30;
  RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[7])
                          (this->delegate_,section_name.size_,local_30,section_name.data_);
  bVar1 = Succeeded(RVar2);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    PrintError(this,"BeginCustomSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>::
  ValueRestoreGuard((ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>
                     *)local_58,this);
  this->reading_custom_section_ = true;
  local_d9 = false;
  if ((this->options_->read_debug_names & 1U) != 0) {
    local_68 = (char *)local_30;
    local_60 = section_name.data_;
    string_view::string_view(&local_78,"name");
    x_01.size_ = (size_type)local_60;
    x_01.data_ = local_68;
    local_d9 = wabt::operator==(x_01,local_78);
  }
  if (local_d9 == false) {
    local_90 = (char *)local_30;
    local_88 = section_name.data_;
    string_view::string_view(&local_a0,"dylink");
    x_00.size_ = (size_type)local_88;
    x_00.data_ = local_90;
    bVar1 = wabt::operator==(x_00,local_a0);
    if (bVar1) {
      local_a4 = (Enum)ReadDylinkSection(this,section_name.size_);
      bVar1 = Failed((Result)local_a4);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        goto LAB_00393b75;
      }
    }
    else {
      sVar3 = string_view::rfind((string_view *)local_30,"reloc",0);
      if (sVar3 == 0) {
        local_a8 = (Enum)ReadRelocSection(this,section_name.size_);
        bVar1 = Failed((Result)local_a8);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          goto LAB_00393b75;
        }
      }
      else {
        local_b8 = (char *)local_30;
        local_b0 = section_name.data_;
        string_view::string_view(&local_c8,"linking");
        x.size_ = (size_type)local_b0;
        x.data_ = local_b8;
        bVar1 = wabt::operator==(x,local_c8);
        if (bVar1) {
          RVar2 = ReadLinkingSection(this,section_name.size_);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            goto LAB_00393b75;
          }
        }
        else {
          (this->state_).offset = this->read_end_;
        }
      }
    }
  }
  else {
    local_7c = (Enum)ReadNameSection(this,section_name.size_);
    bVar1 = Failed((Result)local_7c);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      goto LAB_00393b75;
    }
    this->did_read_names_section_ = true;
  }
  RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[8])();
  bVar1 = Succeeded(RVar2);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    PrintError(this,"EndCustomSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
LAB_00393b75:
  local_80 = 1;
  ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>::
  ~ValueRestoreGuard((ValueRestoreGuard<bool,_&wabt::(anonymous_namespace)::BinaryReader::reading_custom_section_>
                      *)local_58);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadCustomSection(Offset section_size) {
  string_view section_name;
  CHECK_RESULT(ReadStr(&section_name, "section name"));
  CALLBACK(BeginCustomSection, section_size, section_name);
  ValueRestoreGuard<bool, &BinaryReader::reading_custom_section_> guard(this);
  reading_custom_section_ = true;

  if (options_.read_debug_names && section_name == WABT_BINARY_SECTION_NAME) {
    CHECK_RESULT(ReadNameSection(section_size));
    did_read_names_section_ = true;
  } else if (section_name == WABT_BINARY_SECTION_DYLINK) {
    CHECK_RESULT(ReadDylinkSection(section_size));
  } else if (section_name.rfind(WABT_BINARY_SECTION_RELOC, 0) == 0) {
    // Reloc sections always begin with "reloc."
    CHECK_RESULT(ReadRelocSection(section_size));
  } else if (section_name == WABT_BINARY_SECTION_LINKING) {
    CHECK_RESULT(ReadLinkingSection(section_size));
  } else {
    // This is an unknown custom section, skip it.
    state_.offset = read_end_;
  }
  CALLBACK0(EndCustomSection);
  return Result::Ok;
}